

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QSpanCollection::updateInsertedRows(QSpanCollection *this,int start,int end)

{
  Index *this_00;
  int *piVar1;
  iterator __begin1;
  QSpanCollection *pQVar2;
  const_iterator afirst;
  const_iterator alast;
  int iVar3;
  iterator __end1;
  long in_FS_OFFSET;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QSpanCollection *)
           (this->spans).
           super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (pQVar2 != this) {
    iVar3 = (end - start) + 1;
    do {
      piVar1 = (int *)(pQVar2->spans).
                      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                      ._M_impl._M_node._M_size;
      if (start <= piVar1[2]) {
        if (start <= *piVar1) {
          *piVar1 = *piVar1 + iVar3;
        }
        piVar1[2] = piVar1[2] + iVar3;
      }
      pQVar2 = (QSpanCollection *)
               (pQVar2->spans).
               super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    } while (pQVar2 != this);
    this_00 = &this->index;
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
    afirst._M_node =
         *(_Base_ptr *)
          ((long)&(((this->index).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
    if ((_Rb_tree_header *)afirst._M_node !=
        &(((this->index).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      do {
        if (-*(int *)((long)afirst._M_node + 0x20) < start) {
          afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst._M_node);
        }
        else {
          local_34 = *(int *)((long)afirst._M_node + 0x20) - iVar3;
          QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                    (this_00,&local_34,
                     (QMap<int,_QSpanCollection::Span_*> *)((long)afirst._M_node + 0x28));
          alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
          afirst._M_node =
               (_Base_ptr)
               QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase(this_00,afirst._M_node,alast);
        }
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
      } while ((_Rb_tree_header *)afirst._M_node !=
               &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanCollection::updateInsertedRows(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (Span *span : spans) {
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_bottom < start)
            continue;
        if (span->m_top >= start)
            span->m_top += delta;
        span->m_bottom += delta;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ) {
        int y = -it_y.key();
        if (y < start) {
            ++it_y;
            continue;
        }

        index.insert(-y - delta, it_y.value());
        it_y = index.erase(it_y);
    }
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
#endif
}